

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmtm.c
# Opt level: O3

int it_mtm_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f)

{
  byte *pbVar1;
  int iVar2;
  char *ptr;
  long lVar3;
  int iVar4;
  
  if ((sample->flags & 0x10) == 0) {
    iVar4 = sample->length;
  }
  else {
    iVar4 = sample->length;
    iVar2 = sample->loop_end;
    if (iVar4 - iVar2 != 0 && iVar2 <= iVar4) {
      sample->length = iVar2;
      lVar3 = (long)(iVar4 - iVar2);
      goto LAB_00710b9f;
    }
  }
  lVar3 = 0;
  iVar2 = iVar4;
LAB_00710b9f:
  ptr = (char *)malloc((long)iVar2);
  sample->data = ptr;
  iVar4 = -1;
  if (ptr != (char *)0x0) {
    dumbfile_getnc(ptr,iVar2,f);
    dumbfile_skip(f,lVar3);
    iVar2 = dumbfile_error(f);
    if (iVar2 == 0) {
      if (sample->length < 1) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        lVar3 = 0;
        do {
          pbVar1 = (byte *)((long)sample->data + lVar3);
          *pbVar1 = *pbVar1 ^ 0x80;
          lVar3 = lVar3 + 1;
        } while (lVar3 < sample->length);
      }
    }
  }
  return iVar4;
}

Assistant:

static int it_mtm_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	sample->data = malloc(sample->length);

	if (!sample->data)
		return -1;

	dumbfile_getnc((char *)sample->data, sample->length, f);
	dumbfile_skip(f, truncated_size);

	if (dumbfile_error(f))
		return -1;

	for (i = 0; i < sample->length; i++)
		((signed char *)sample->data)[i] ^= 0x80;

	return 0;
}